

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutOracle.c
# Opt level: O2

void Cut_OracleNodeSetTriv(Cut_Oracle_t *p,int Node)

{
  Vec_Ptr_t *p_00;
  void *pvVar1;
  Cut_Cut_t *Entry;
  
  pvVar1 = Vec_PtrEntry(p->vCutsNew,Node);
  if (pvVar1 == (void *)0x0) {
    p_00 = p->vCutsNew;
    Entry = Cut_CutTriv(p,Node);
    Vec_PtrWriteEntry(p_00,Node,Entry);
    return;
  }
  __assert_fail("Vec_PtrEntry( p->vCutsNew, Node ) == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/cut/cutOracle.c"
                ,0xc2,"void Cut_OracleNodeSetTriv(Cut_Oracle_t *, int)");
}

Assistant:

void Cut_OracleNodeSetTriv( Cut_Oracle_t * p, int Node )
{
    assert( Vec_PtrEntry( p->vCutsNew, Node ) == NULL );
    Vec_PtrWriteEntry( p->vCutsNew, Node, Cut_CutTriv(p, Node) );
}